

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<unsigned_int>::test_many<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom)

{
  ulong uVar1;
  uint uVar2;
  uint extraout_EAX;
  int32_t i;
  int iVar3;
  int i_1;
  long lVar4;
  DivideTest<unsigned_int> *unaff_R14;
  divider<unsigned_int,_(libdivide::Branching)1> the_divider;
  divider<unsigned_int,_(libdivide::Branching)1> local_58;
  string_class local_50;
  
  if (denom == 1) {
    return;
  }
  if (denom == 0) {
    test_many<(libdivide::Branching)1>();
    uVar2 = extraout_EAX;
  }
  else {
    if ((denom - 1 & denom) == 0) {
      local_58.div.denom.magic = 0;
      local_58.div.denom.more = 0x1e - (byte)LZCOUNT(denom);
    }
    else {
      local_58.div.denom.more = (byte)LZCOUNT(denom) ^ 0x1f;
      uVar1 = (ulong)(uint)(1 << (local_58.div.denom.more & 0x1f)) << 0x20;
      iVar3 = (int)(uVar1 % (ulong)denom);
      local_58.div.denom.magic =
           (iVar3 < 0 || denom <= (uint)(iVar3 * 2)) + 1 + (int)(uVar1 / denom) * 2;
    }
    local_58.div.denom.more = local_58.div.denom.more & 0x1f;
    uVar2 = libdivide::divider<unsigned_int,_(libdivide::Branching)1>::recover(&local_58);
    unaff_R14 = this;
    if (uVar2 == denom) {
      lVar4 = 0;
      do {
        test_one<(libdivide::Branching)1>(this,*(uint *)((long)edgeCases + lVar4),denom,&local_58);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x170);
      uVar2 = 0;
      do {
        test_one<(libdivide::Branching)1>(this,uVar2,denom,&local_58);
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x10000);
      uVar2 = 1;
      do {
        iVar3 = -1;
        do {
          test_one<(libdivide::Branching)1>(this,(1 << (uVar2 & 0x1f)) + iVar3,denom,&local_58);
          iVar3 = iVar3 + 1;
        } while (iVar3 != 2);
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x20);
      uVar2 = 0xffffffff;
      do {
        test_one<(libdivide::Branching)1>(this,uVar2,denom,&local_58);
        uVar2 = uVar2 * 2;
      } while (uVar2 != 0);
      test_random_numerators<(libdivide::Branching)1>(this,denom,&local_58);
      test_vectordivide_numerators<(libdivide::Branching)1>(this,denom,&local_58);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to recover divisor for ",0x1e);
  testcase_name_abi_cxx11_(&local_50,unaff_R14,1);
  std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,uVar2);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }